

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O3

void __thiscall Guild::DelMember(Guild *this,string *kicked,Character *kicker,bool alert)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  World *pWVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t sVar6;
  EOServer *pEVar7;
  _List_node_base *p_Var8;
  long lVar9;
  bool bVar10;
  int iVar11;
  mapped_type *this_00;
  long *plVar12;
  size_type *psVar13;
  pointer psVar14;
  _List_node_base *p_Var15;
  iterator __position;
  _List_node_base *p_Var16;
  string msg;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  World *local_98;
  string local_90;
  string local_70;
  Database_Result local_50;
  
  util::lowercase(&local_f8,kicked);
  std::__cxx11::string::operator=((string *)kicked,(string *)&local_f8);
  paVar1 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (alert) {
    pWVar3 = this->manager->world;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"GuildAnnounce","");
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->config,&local_f8);
    bVar10 = util::variant::GetBool(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar10) {
      pWVar3 = this->manager->world;
      paVar2 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"guild_leave","");
      util::ucfirst(&local_d8,kicked);
      I18N::Format<std::__cxx11::string>(&local_f8,&pWVar3->i18n,&local_118,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (kicker != (Character *)0x0) {
        pWVar3 = this->manager->world;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"guild_kick","");
        util::ucfirst(&local_70,&kicker->real_name);
        I18N::Format<std::__cxx11::string>(&local_d8,&pWVar3->i18n,&local_b8,&local_70);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x1d699e);
        psVar13 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_118.field_2._M_allocated_capacity = *psVar13;
          local_118.field_2._8_8_ = plVar12[3];
          local_118._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar13;
          local_118._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_118._M_string_length = plVar12[1];
        *plVar12 = (long)psVar13;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_118._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_f8._M_dataplus._M_p,
                 local_f8._M_dataplus._M_p + local_f8._M_string_length);
      Msg(this,(Character *)0x0,&local_90,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  psVar14 = (this->members).
            super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar14 !=
      (this->members).
      super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __position._M_current = psVar14;
    do {
      peVar4 = (psVar14->super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var5 = (psVar14->super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      sVar6 = (peVar4->name)._M_string_length;
      if ((sVar6 == kicked->_M_string_length) &&
         ((sVar6 == 0 ||
          (iVar11 = bcmp((peVar4->name)._M_dataplus._M_p,(kicked->_M_dataplus)._M_p,sVar6),
          iVar11 == 0)))) {
        std::vector<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
        ::_M_erase(&this->members,__position);
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        break;
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      psVar14 = psVar14 + 1;
      __position._M_current = __position._M_current + 1;
    } while (psVar14 !=
             (this->members).
             super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_98 = this->manager->world;
  pEVar7 = local_98->server;
  p_Var16 = (pEVar7->super_Server).clients.super__List_base<Client_*,_std::allocator<Client_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var16 == (_List_node_base *)&(pEVar7->super_Server).clients) {
      Database::Query(&local_50,&local_98->db,
                      "UPDATE `characters` SET `guild` = NULL, `guild_rank` = NULL, `guild_rank_string` = NULL WHERE `name` = \'$\'"
                      ,(kicked->_M_dataplus)._M_p);
      std::
      vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
      ::~vector(&local_50.
                 super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
               );
      return;
    }
    p_Var8 = *(_List_node_base **)((long)(p_Var16[1]._M_next + 0x10) + 8);
    if (p_Var8 != (_List_node_base *)0x0) {
      p_Var15 = p_Var8[5]._M_next;
      p_Var8 = *(_List_node_base **)((long)(p_Var8 + 5) + 8);
      if (p_Var15 != p_Var8) {
        sVar6 = kicked->_M_string_length;
        do {
          lVar9 = (long)p_Var15->_M_next;
          if ((*(size_t *)(lVar9 + 0x20) == sVar6) &&
             ((sVar6 == 0 ||
              (iVar11 = bcmp(*(void **)(lVar9 + 0x18),(kicked->_M_dataplus)._M_p,sVar6), iVar11 == 0
              )))) {
            p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x3f0);
            *(undefined8 *)(lVar9 + 1000) = 0;
            *(undefined8 *)(lVar9 + 0x3f0) = 0;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            *(undefined1 *)(lVar9 + 0x408) = 0;
            *(undefined8 *)(lVar9 + 0x418) = 0;
            **(undefined1 **)(lVar9 + 0x410) = 0;
            if (*(char *)(lVar9 + 0xc) != '\0') {
              return;
            }
            break;
          }
          p_Var15 = (_List_node_base *)&p_Var15->_M_prev;
        } while (p_Var15 != p_Var8);
      }
    }
    p_Var16 = p_Var16->_M_next;
  } while( true );
}

Assistant:

void Guild::DelMember(std::string kicked, Character *kicker, bool alert)
{
	kicked = util::lowercase(kicked);

	if (alert && this->manager->world->config["GuildAnnounce"])
	{
		std::string msg = manager->world->i18n.Format("guild_leave", util::ucfirst(kicked));

		if (kicker)
			msg += " " + manager->world->i18n.Format("guild_kick", util::ucfirst(kicker->real_name));

		this->Msg(0, msg);
	}

	UTIL_IFOREACH(this->members, it)
	{
		std::shared_ptr<Guild_Member> member = *it;

		if (member->name == kicked)
		{
			this->members.erase(it);
			break;
		}
	}

	World* world = this->manager->world;

	UTIL_FOREACH(world->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->player)
		{
			UTIL_FOREACH(eoclient->player->characters, character)
			{
				if (character->real_name == kicked)
				{
					character->guild.reset();
					character->guild_rank = 0;
					character->guild_rank_string.clear();
					// *this may not be valid after this point

					if (character->online)
						return;
					else
						break;
				}
			}
		}
	}

	world->db.Query("UPDATE `characters` SET `guild` = NULL, `guild_rank` = NULL, `guild_rank_string` = NULL WHERE `name` = '$'", kicked.c_str());
}